

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring64_bitmap_flip_closed_inplace(roaring64_bitmap_t *r,uint64_t min,uint64_t max)

{
  int iVar1;
  long lVar2;
  bitset_container_t *c;
  uint8_t typecode;
  _Bool _Var3;
  uint uVar4;
  art_val_t *paVar5;
  array_container_t *paVar6;
  uint16_t *puVar7;
  bitset_container_t *pbVar8;
  leaf_t val;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint32_t min_00;
  ulong uVar12;
  bool bVar13;
  uint8_t current_high48_key [6];
  uint8_t local_61;
  bitset_container_t *local_60;
  uint local_58;
  ushort local_54;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  if (min <= max) {
    local_40 = min >> 0x10;
    uVar12 = max >> 0x10;
    if (local_40 <= uVar12) {
      local_50 = (ulong)((uint)min & 0xffff);
      local_38 = (ulong)(((uint)max & 0xffff) + 1);
      uVar11 = local_40;
      local_48 = uVar12;
      do {
        local_58 = ((uint)(uVar11 >> 0x20) & 0xff00) >> 8 | (uint)(uVar11 >> 0x18) & 0xff00 |
                   (uint)(uVar11 >> 8) & 0xff0000 | (uint)(((uVar11 & 0xff0000) << 0x18) >> 0x10);
        local_54 = (ushort)(uVar11 >> 8) & 0xff | (ushort)((uVar11 << 0x38) >> 0x30);
        min_00 = 0;
        if (uVar11 == local_40) {
          min_00 = (uint32_t)local_50;
        }
        uVar4 = 0x10000;
        if (uVar11 == uVar12) {
          uVar4 = (uint)local_38;
        }
        paVar5 = art_find(&r->art,(art_key_chunk_t *)&local_58);
        if (paVar5 == (art_val_t *)0x0) {
          if ((uVar4 - min_00) + 1 < 3) {
            paVar6 = array_container_create_range(min_00,uVar4);
            typecode = '\x02';
          }
          else {
            paVar6 = (array_container_t *)(*global_memory_hook.malloc)(0x10);
            if (paVar6 == (array_container_t *)0x0) {
LAB_0012ac9c:
              paVar6 = (array_container_t *)0x0;
            }
            else {
              puVar7 = (uint16_t *)(*global_memory_hook.malloc)(4);
              paVar6->array = puVar7;
              if (puVar7 == (uint16_t *)0x0) {
                (*global_memory_hook.free)(paVar6);
                goto LAB_0012ac9c;
              }
              paVar6->cardinality = 0;
              paVar6->capacity = 1;
            }
            typecode = '\x03';
            if (paVar6 != (array_container_t *)0x0) {
              *(uint *)(paVar6->array + (long)paVar6->cardinality * 2) =
                   (uVar4 + ~min_00) * 0x10000 | min_00;
              paVar6->cardinality = paVar6->cardinality + 1;
            }
          }
          val = add_container(r,paVar6,typecode);
          art_insert(&r->art,(art_key_chunk_t *)&local_58,val);
        }
        else {
          uVar12 = *paVar5 >> 8;
          local_61 = (uint8_t)*paVar5;
          if (uVar4 < 0x10000 || min_00 != 0) {
            paVar6 = (array_container_t *)r->containers[uVar12];
            if (local_61 == '\x04') {
              paVar6 = (array_container_t *)
                       shared_container_extract_copy((shared_container_t *)paVar6,&local_61);
            }
            local_60 = (bitset_container_t *)0x0;
            if (local_61 == '\x03') goto LAB_0012ac0f;
            if (local_61 != '\x02') goto LAB_0012ac31;
            _Var3 = array_container_negation_range(paVar6,min_00,uVar4,&local_60);
            if (paVar6 != (array_container_t *)0x0) {
              (*global_memory_hook.free)(paVar6->array);
              (*global_memory_hook.free)(paVar6);
            }
            uVar12 = (ulong)(byte)(2 - _Var3);
          }
          else {
            paVar6 = (array_container_t *)r->containers[uVar12];
            if (local_61 == '\x04') {
              paVar6 = (array_container_t *)
                       shared_container_extract_copy((shared_container_t *)paVar6,&local_61);
            }
            local_60 = (bitset_container_t *)0x0;
            if (local_61 == '\x03') {
              min_00 = 0;
              uVar4 = 0x10000;
LAB_0012ac0f:
              local_60 = (bitset_container_t *)0x0;
              uVar4 = run_container_negation_range_inplace
                                ((run_container_t *)paVar6,min_00,uVar4,&local_60);
              uVar12 = (ulong)uVar4;
            }
            else if (local_61 == '\x02') {
              local_60 = bitset_container_create();
              array_container_negation(paVar6,local_60);
              uVar12 = 1;
              if (paVar6 != (array_container_t *)0x0) {
                (*global_memory_hook.free)(paVar6->array);
                (*global_memory_hook.free)(paVar6);
              }
            }
            else {
              min_00 = 0;
              uVar4 = 0x10000;
LAB_0012ac31:
              local_60 = (bitset_container_t *)0x0;
              _Var3 = bitset_container_negation_range_inplace
                                ((bitset_container_t *)paVar6,min_00,uVar4,&local_60);
              uVar12 = (ulong)(byte)(2 - _Var3);
            }
          }
          c = local_60;
          uVar4 = (uint)uVar12;
          pbVar8 = local_60;
          if ((uint8_t)uVar12 == '\x04') {
            uVar4 = (uint)*(byte *)&local_60->words;
            pbVar8 = *(bitset_container_t **)local_60;
          }
          iVar1 = pbVar8->cardinality;
          if (((char)uVar4 == '\x03') || ((uVar4 & 0xff) == 2)) {
            bVar13 = 0 < iVar1;
          }
          else {
            if (iVar1 == -1) {
              if (*pbVar8->words == 0) {
                uVar9 = 0xffffffffffffffff;
                do {
                  if (uVar9 == 0x3fe) {
                    uVar10 = 0x3ff;
                    break;
                  }
                  uVar10 = uVar9 + 1;
                  lVar2 = uVar9 + 2;
                  uVar9 = uVar10;
                } while (pbVar8->words[lVar2] == 0);
                bVar13 = 0x3fe < uVar10;
              }
              else {
                bVar13 = false;
              }
            }
            else {
              bVar13 = iVar1 == 0;
            }
            bVar13 = (bool)(bVar13 ^ 1);
          }
          if (bVar13) {
            uVar9 = *paVar5;
            r->containers[uVar9 >> 8] = local_60;
            *paVar5 = uVar12 & 0xff | uVar9 & 0xffffffffffffff00;
            uVar12 = local_48;
          }
          else {
            art_erase(&r->art,(art_key_chunk_t *)&local_58,(art_val_t *)0x0);
            container_free(c,(uint8_t)uVar12);
            uVar9 = *paVar5 >> 8;
            r->containers[uVar9] = (container_t *)0x0;
            uVar12 = local_48;
            if (uVar9 < r->first_free) {
              r->first_free = uVar9;
            }
          }
        }
        bVar13 = uVar11 != uVar12;
        uVar11 = uVar11 + 1;
      } while (bVar13);
    }
  }
  return;
}

Assistant:

void roaring64_bitmap_flip_closed_inplace(roaring64_bitmap_t *r, uint64_t min,
                                          uint64_t max) {
    if (min > max) {
        return;
    }
    uint16_t min_low16 = (uint16_t)min;
    uint16_t max_low16 = (uint16_t)max;
    uint64_t min_high48_bits = (min & 0xFFFFFFFFFFFF0000ULL) >> 16;
    uint64_t max_high48_bits = (max & 0xFFFFFFFFFFFF0000ULL) >> 16;

    // Flip the range (including non-existent containers!) between min and
    // max.
    for (uint64_t high48_bits = min_high48_bits; high48_bits <= max_high48_bits;
         high48_bits++) {
        uint8_t current_high48_key[ART_KEY_BYTES];
        split_key(high48_bits << 16, current_high48_key);

        uint32_t min_container = 0;
        if (high48_bits == min_high48_bits) {
            min_container = min_low16;
        }
        uint32_t max_container = 0xFFFF + 1;  // Exclusive range.
        if (high48_bits == max_high48_bits) {
            max_container = max_low16 + 1;  // Exclusive.
        }

        roaring64_flip_leaf_inplace(r, current_high48_key, min_container,
                                    max_container);
    }
}